

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O2

int linenoise::unicodeReadUTF8Char(int fd,char *buf,int *cp)

{
  byte bVar1;
  int iVar2;
  ssize_t sVar3;
  size_t sStack_20;
  
  sVar3 = read(fd,buf,1);
  if ((int)sVar3 < 1) {
    return (int)sVar3;
  }
  bVar1 = *buf;
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 0xe0) == 0xc0) {
      sStack_20 = 1;
    }
    else if ((bVar1 & 0xf0) == 0xe0) {
      sStack_20 = 2;
    }
    else {
      if ((bVar1 & 0xf8) != 0xf0) {
        return -1;
      }
      sStack_20 = 3;
    }
    sVar3 = read(fd,buf + 1,sStack_20);
    if ((int)sVar3 < 1) {
      return (int)sVar3;
    }
  }
  iVar2 = unicodeUTF8CharToCodePoint(buf,4,cp);
  return iVar2;
}

Assistant:

inline int unicodeReadUTF8Char(int fd, char* buf, int* cp)
{
    int nread = read(fd,&buf[0],1);

    if (nread <= 0) { return nread; }

    unsigned char byte = buf[0];

    if ((byte & 0x80) == 0) {
        ;
    } else if ((byte & 0xE0) == 0xC0) {
        nread = read(fd,&buf[1],1);
        if (nread <= 0) { return nread; }
    } else if ((byte & 0xF0) == 0xE0) {
        nread = read(fd,&buf[1],2);
        if (nread <= 0) { return nread; }
    } else if ((byte & 0xF8) == 0xF0) {
        nread = read(fd,&buf[1],3);
        if (nread <= 0) { return nread; }
    } else {
        return -1;
    }

    return unicodeUTF8CharToCodePoint(buf, 4, cp);
}